

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::insert(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
         *this,value_type *value)

{
  ulong uVar1;
  node *pnVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  long *plVar8;
  undefined4 extraout_var_01;
  long lVar9;
  uint uVar10;
  int iVar11;
  locType extraout_RDX;
  long lVar12;
  locType wz;
  long lVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  lnk;
  pair<unsigned_long_long,_int> tmpk [100];
  long tmpv [100];
  undefined8 uStack_9a0;
  undefined8 local_998;
  ulong auStack_990 [2];
  undefined4 auStack_980 [394];
  long local_358;
  undefined1 local_350 [800];
  node *pnVar7;
  undefined4 extraout_var_00;
  
  uVar1 = (value->first).first;
  iVar11 = (value->first).second;
  lVar14 = value->second;
  lVar6 = (long)this->depth;
  if (lVar6 == 0) {
    iVar4 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar8 = (long *)CONCAT44(extraout_var_00,iVar4);
    this->root = extraout_RDX;
    this->depth = 1;
    *(undefined4 *)(plVar8 + 299) = 1;
    plVar8[0x65] = uVar1;
    *(int *)(plVar8 + 0x66) = iVar11;
    *plVar8 = lVar14;
    plVar8[100] = -1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
  }
  else {
    uVar20 = lVar6 * 8;
    uVar18 = lVar6 << 2;
    if (this->depth < 0) {
      uVar20 = 0xffffffffffffffff;
      uVar18 = 0xffffffffffffffff;
    }
    pos = (locType *)operator_new__(uVar20);
    *pos = 0;
    p = (node **)operator_new__(uVar20);
    pp = (int *)operator_new__(uVar18);
    *pos = this->root;
    iVar4 = this->depth;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        iVar4 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])(this->file,pos + lVar6);
        pnVar7 = (node *)CONCAT44(extraout_var,iVar4);
        p[lVar6] = pnVar7;
        uVar10 = pnVar7->sz;
        bVar21 = 0 < (int)uVar10;
        if ((int)uVar10 < 1) {
          uVar20 = 0;
        }
        else {
          piVar15 = &pnVar7->keyvalue[0].second;
          uVar20 = 0;
          do {
            if ((uVar1 <= ((pair<unsigned_long_long,_int> *)(piVar15 + -2))->first) &&
               ((uVar1 < ((pair<unsigned_long_long,_int> *)(piVar15 + -2))->first ||
                (iVar11 <= *piVar15)))) goto LAB_001121f2;
            uVar20 = uVar20 + 1;
            bVar21 = uVar20 < uVar10;
            piVar15 = piVar15 + 4;
          } while (uVar10 != uVar20);
          uVar20 = (ulong)uVar10;
        }
LAB_001121f2:
        if (lVar6 < (long)this->depth + -1) {
          if (bVar21) {
            uVar18 = pnVar7->keyvalue[uVar20 & 0xffffffff].first;
            uVar10 = 0;
            if ((uVar18 <= uVar1) && (uVar10 = 1, uVar1 <= uVar18)) {
              uVar10 = (uint)(pnVar7->keyvalue[uVar20 & 0xffffffff].second <= iVar11);
            }
            uVar20 = (ulong)((int)uVar20 + uVar10);
          }
          (pos + lVar6)[1] = (pnVar7->field_0).val[(int)uVar20];
        }
        pp[lVar6] = (int)uVar20;
        lVar6 = lVar6 + 1;
        iVar4 = this->depth;
      } while (lVar6 < iVar4);
    }
    pnVar7 = p[(long)iVar4 + -1];
    iVar19 = (int)uVar20;
    if (iVar19 < pnVar7->sz) {
      uVar18 = pnVar7->keyvalue[iVar19].first;
      if ((uVar18 <= uVar1) && ((uVar18 < uVar1 || (pnVar7->keyvalue[iVar19].second <= iVar11)))) {
        operator_delete__(p);
        operator_delete__(pp);
        operator_delete__(pos);
        return false;
      }
    }
    if (1 < iVar4 && iVar19 == 0) {
      lVar6 = (ulong)(iVar4 - 2) + 1;
      do {
        lVar12 = (long)pp[lVar6 + -1];
        if (lVar12 != 0) {
          uVar18 = pnVar7->keyvalue[0].first;
          pnVar2 = p[lVar6 + -1];
          uVar3 = pnVar2->keyvalue[lVar12 + -1].first;
          if (((uVar3 <= uVar18) && (uVar18 <= uVar3)) &&
             (pnVar2->keyvalue[lVar12 + -1].second == pnVar7->keyvalue[0].second)) {
            pnVar2->keyvalue[lVar12 + -1].first = uVar1;
            pnVar2->keyvalue[lVar12 + -1].second = iVar11;
            (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              )._vptr_FileManager_Base[3])();
            break;
          }
        }
        lVar12 = lVar6 + -1;
        bVar21 = 0 < lVar6;
        lVar6 = lVar12;
      } while (lVar12 != 0 && bVar21);
    }
    lVar6 = (long)p[(long)iVar4 + -1]->sz;
    if (lVar6 < 99) {
      if (iVar19 < p[(long)iVar4 + -1]->sz) {
        lVar12 = lVar6 * 0x10 + 0x330;
        do {
          pnVar7 = p[(long)iVar4 + -1];
          *(undefined8 *)((long)pnVar7 + lVar12 + -8) =
               *(undefined8 *)((long)pnVar7 + lVar12 + -0x18);
          *(undefined4 *)((long)&pnVar7->field_0 + lVar12) =
               *(undefined4 *)((long)pnVar7 + lVar12 + -0x10);
          (pnVar7->field_0).val[lVar6] = *(long *)((long)pnVar7 + lVar6 * 8 + -8);
          lVar6 = lVar6 + -1;
          lVar12 = lVar12 + -0x10;
        } while (iVar19 < lVar6);
      }
      pnVar7 = p[(long)iVar4 + -1];
      pnVar7->keyvalue[iVar19].first = uVar1;
      pnVar7->keyvalue[iVar19].second = iVar11;
      (pnVar7->field_0).val[iVar19] = lVar14;
      p[(long)iVar4 + -1]->sz = p[(long)iVar4 + -1]->sz + 1;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    }
    else {
      lVar6 = 8;
      do {
        *(undefined8 *)((long)&uStack_9a0 + lVar6) = 0;
        *(undefined4 *)((long)auStack_990 + lVar6 + -8) = 0;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x648);
      iVar5 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[1])();
      lVar6 = CONCAT44(extraout_var_01,iVar5);
      if (0 < iVar19) {
        pnVar7 = p[(long)iVar4 + -1];
        memcpy(&local_358,pnVar7,(uVar20 & 0xffffffff) * 8);
        lVar12 = 0;
        do {
          *(undefined8 *)((long)auStack_990 + lVar12 + -8) =
               *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar12);
          *(undefined4 *)((long)auStack_990 + lVar12) =
               *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar12);
          lVar12 = lVar12 + 0x10;
        } while ((uVar20 & 0xffffffff) << 4 != lVar12);
      }
      lVar12 = (long)iVar19;
      *(long *)(local_350 + lVar12 * 8 + -8) = lVar14;
      lVar14 = lVar12 * 0x10;
      auStack_990[lVar12 * 2 + -1] = uVar1;
      *(int *)(auStack_990 + lVar12 * 2) = iVar11;
      if (iVar19 < 99) {
        pnVar7 = p[(long)iVar4 + -1];
        memcpy(local_350 + lVar12 * 8,(void *)((long)&pnVar7->field_0 + lVar12 * 8),
               (ulong)(0x62 - iVar19) * 8 + 8);
        lVar12 = lVar12 + -99;
        do {
          *(undefined8 *)((long)auStack_990 + lVar14 + 8) =
               *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar14);
          *(undefined4 *)((long)auStack_980 + lVar14) =
               *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar14);
          lVar14 = lVar14 + 0x10;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
      pnVar7 = p[(long)iVar4 + -1];
      *(locType *)(lVar6 + 800) = pnVar7->nxt;
      pnVar7->sz = 0x32;
      pnVar7 = p[(long)iVar4 + -1];
      iVar11 = pnVar7->sz;
      if (0 < iVar11) {
        lVar14 = 0;
        lVar12 = 0;
        do {
          (pnVar7->field_0).val[lVar12] = *(long *)(local_350 + lVar12 * 8 + -8);
          pnVar7 = p[(long)iVar4 + -1];
          *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar14) =
               *(undefined8 *)((long)auStack_990 + lVar14 + -8);
          *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar14) =
               *(undefined4 *)((long)auStack_990 + lVar14);
          lVar12 = lVar12 + 1;
          pnVar7 = p[(long)iVar4 + -1];
          iVar11 = pnVar7->sz;
          lVar14 = lVar14 + 0x10;
        } while (lVar12 < iVar11);
      }
      pnVar7->nxt = wz;
      if (iVar11 < 100) {
        lVar9 = (long)iVar11;
        lVar16 = lVar9 * 0x10;
        lVar14 = lVar9 * 8;
        lVar12 = lVar9 * 8;
        lVar17 = 0;
        do {
          lVar9 = lVar9 + 1;
          *(undefined8 *)(lVar6 + lVar14 + (long)p[(long)iVar4 + -1]->sz * -8 + lVar17) =
               *(undefined8 *)(local_350 + lVar17 + lVar12 + -8);
          lVar13 = lVar6 + lVar16 + (long)p[(long)iVar4 + -1]->sz * -0x10;
          *(undefined8 *)(lVar13 + 0x328 + lVar17 * 2) =
               *(undefined8 *)((long)auStack_990 + lVar17 * 2 + lVar16 + -8);
          *(undefined4 *)(lVar13 + 0x330 + lVar17 * 2) =
               *(undefined4 *)((long)auStack_990 + lVar17 * 2 + lVar16);
          lVar17 = lVar17 + 8;
        } while ((int)lVar9 != 100);
      }
      *(int *)(lVar6 + 0x958) = 100 - p[(long)iVar4 + -1]->sz;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
      uStack_9a0._4_4_ = this->depth + -2;
      insertnonleaf(this,(pair<unsigned_long_long,_int> *)(lVar6 + 0x328),
                    (int *)((long)&uStack_9a0 + 4),p,pp,pos,wz);
    }
    operator_delete__(p);
    operator_delete__(pp);
    operator_delete__(pos);
    this->siz = this->siz + 1;
  }
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }